

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.hpp
# Opt level: O2

token __thiscall
wigwag::
signal<void(),wigwag::exception_handling::none,wigwag::threading::none,wigwag::state_populating::none,wigwag::life_assurance::none,wigwag::creation::lazy,wigwag::ref_counter::single_threaded>
::connect<std::function<void()>>
          (signal<void(),wigwag::exception_handling::none,wigwag::threading::none,wigwag::state_populating::none,wigwag::life_assurance::none,wigwag::creation::lazy,wigwag::ref_counter::single_threaded>
           *this,function<void_()> *handler,handler_attributes attributes)

{
  long lVar1;
  signal_impl<void_(),_wigwag::exception_handling::none,_wigwag::threading::none,_wigwag::state_populating::none,_wigwag::life_assurance::none,_wigwag::ref_counter::single_threaded>
  *psVar2;
  uint in_ECX;
  undefined4 in_register_00000014;
  undefined8 *puVar3;
  _Any_data local_38;
  long local_28;
  undefined8 local_20;
  
  puVar3 = (undefined8 *)CONCAT44(in_register_00000014,attributes);
  psVar2 = wigwag::detail::
           creation_storage_adapter<wigwag::creation::lazy::storage<wigwag::detail::intrusive_ptr<wigwag::detail::signal_impl<void_(),_wigwag::exception_handling::none,_wigwag::threading::none,_wigwag::state_populating::none,_wigwag::life_assurance::none,_wigwag::ref_counter::single_threaded>_>,_wigwag::detail::signal_impl<void_(),_wigwag::exception_handling::none,_wigwag::threading::none,_wigwag::state_populating::none,_wigwag::life_assurance::none,_wigwag::ref_counter::single_threaded>_>_>
           ::operator->((creation_storage_adapter<wigwag::creation::lazy::storage<wigwag::detail::intrusive_ptr<wigwag::detail::signal_impl<void_(),_wigwag::exception_handling::none,_wigwag::threading::none,_wigwag::state_populating::none,_wigwag::life_assurance::none,_wigwag::ref_counter::single_threaded>_>,_wigwag::detail::signal_impl<void_(),_wigwag::exception_handling::none,_wigwag::threading::none,_wigwag::state_populating::none,_wigwag::life_assurance::none,_wigwag::ref_counter::single_threaded>_>_>
                         *)handler);
  local_38._M_unused._M_object = (void *)0x0;
  local_38._8_8_ = 0;
  local_28 = 0;
  local_20 = puVar3[3];
  lVar1 = puVar3[2];
  if (lVar1 != 0) {
    local_38._M_unused._0_8_ = (undefined8)*puVar3;
    local_38._8_8_ = puVar3[1];
    puVar3[2] = 0;
    puVar3[3] = 0;
    local_28 = lVar1;
  }
  (*(psVar2->super_signal_connector_impl<void_()>)._vptr_signal_connector_impl[2])
            (this,psVar2,&local_38,(ulong)in_ECX);
  std::_Function_base::~_Function_base((_Function_base *)&local_38);
  return (token)(implementation *)this;
}

Assistant:

token connect(HandlerFunc_ handler, handler_attributes attributes = handler_attributes::none) const
        { return _impl->connect(std::move(handler), attributes); }